

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O2

double __thiscall sophia_interface::ULANGL(sophia_interface *this,double X,double Y)

{
  double dVar1;
  double dVar2;
  
  dVar2 = SQRT(X * X + Y * Y);
  dVar1 = 0.0;
  if (1e-20 <= dVar2) {
    if (0.8 <= ABS(X) / dVar2) {
      dVar2 = asin(Y / dVar2);
      if ((0.0 <= X) || (dVar1 = PARU[0], dVar2 < 0.0)) {
        if (0.0 <= X) {
          return dVar2;
        }
        dVar1 = -PARU[0];
      }
      dVar1 = dVar1 - dVar2;
    }
    else {
      dVar1 = acos(X / dVar2);
      dVar1 = (double)(-(ulong)(Y < 0.0) & (ulong)-dVar1 | ~-(ulong)(Y < 0.0) & (ulong)dVar1);
    }
  }
  return dVar1;
}

Assistant:

double sophia_interface::ULANGL(double X, double Y) {
// Purpose: to reconstruct an angle from given x and y coordinates.
    double result = 0.;
    double R = std::sqrt(X * X + Y * Y);
    if (R < 1e-20) return 0.;
    if (std::abs(X) / R < 0.8) {
        int sgn = (Y < 0)? -1 : 1;
        result = std::acos(X / R) * sgn;
    } else {
        result = std::asin(Y / R);
        if (X < 0. && result >= 0.) {
            result = PARU[0] - result;
        } else if (X < 0.) {
            result = -PARU[0] - result;
        }
    }
    return result;
}